

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O3

uint32_t BinarySpectrumFloat(float *spectrum,SpectrumType *threshold_spectrum,
                            int *threshold_initialized)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  float fVar4;
  
  if (*threshold_initialized == 0) {
    lVar2 = 0;
    do {
      if (0.0 < spectrum[lVar2 + 0xc]) {
        threshold_spectrum[lVar2 + 0xc].float_ = spectrum[lVar2 + 0xc] * 0.5;
        *threshold_initialized = 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
  }
  lVar2 = 0;
  uVar1 = 0;
  do {
    fVar4 = (spectrum[lVar2 + 0xc] - threshold_spectrum[lVar2 + 0xc].float_) * 0.015625 +
            threshold_spectrum[lVar2 + 0xc].float_;
    uVar3 = 1 << ((byte)lVar2 & 0x1f);
    threshold_spectrum[lVar2 + 0xc].float_ = fVar4;
    if (spectrum[lVar2 + 0xc] <= fVar4) {
      uVar3 = 0;
    }
    uVar1 = uVar1 | uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x20);
  return uVar1;
}

Assistant:

static uint32_t BinarySpectrumFloat(const float* spectrum,
                                    SpectrumType* threshold_spectrum,
                                    int* threshold_initialized) {
  int i = kBandFirst;
  uint32_t out = 0;
  const float kScale = 1 / 64.0;

  if (!(*threshold_initialized)) {
    // Set the |threshold_spectrum| to half the input |spectrum| as starting
    // value. This speeds up the convergence.
    for (i = kBandFirst; i <= kBandLast; i++) {
      if (spectrum[i] > 0.0f) {
        threshold_spectrum[i].float_ = (spectrum[i] / 2);
        *threshold_initialized = 1;
      }
    }
  }

  for (i = kBandFirst; i <= kBandLast; i++) {
    // Update the |threshold_spectrum|.
    MeanEstimatorFloat(spectrum[i], kScale, &(threshold_spectrum[i].float_));
    // Convert |spectrum| at current frequency bin to a binary value.
    if (spectrum[i] > threshold_spectrum[i].float_) {
      out = SetBit(out, i - kBandFirst);
    }
  }

  return out;
}